

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indiancal.cpp
# Opt level: O0

int32_t __thiscall
icu_63::IndianCalendar::handleComputeMonthStart
          (IndianCalendar *this,int32_t eyear,int32_t month,UBool param_3)

{
  int32_t iVar1;
  double dVar2;
  double jd;
  int32_t imonth;
  int32_t iStack_14;
  UBool param_3_local;
  int32_t month_local;
  int32_t eyear_local;
  IndianCalendar *this_local;
  
  imonth = month;
  iStack_14 = eyear;
  _month_local = this;
  if ((month < 0) || (0xb < month)) {
    iVar1 = ClockMath::floorDivide((double)month,0xc,&imonth);
    iStack_14 = iVar1 + iStack_14;
  }
  if (imonth == 0xc) {
    jd._0_4_ = 1;
  }
  else {
    jd._0_4_ = imonth + 1;
  }
  dVar2 = IndianToJD(iStack_14,jd._0_4_,1);
  return (int)dVar2;
}

Assistant:

int32_t IndianCalendar::handleComputeMonthStart(int32_t eyear, int32_t month, UBool /* useMonth */ ) const {

   //month is 0 based; converting it to 1-based 
   int32_t imonth;

    // If the month is out of range, adjust it into range, and adjust the extended eyar accordingly
   if (month < 0 || month > 11) {
      eyear += (int32_t)ClockMath::floorDivide(month, 12, month);
   }

   if(month == 12){
       imonth = 1;
   } else {
       imonth = month + 1; 
   }
   
   double jd = IndianToJD(eyear ,imonth, 1);

   return (int32_t)jd;
}